

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_message(Curl_easy *data,uchar cmd,void *msg,size_t msg_len)

{
  connectdata *pcVar1;
  smb_request *psVar2;
  undefined8 *puVar3;
  __pid_t _Var4;
  CURLcode CVar5;
  ushort uVar6;
  connectdata *conn;
  
  pcVar1 = data->conn;
  psVar2 = (data->req).p.smb;
  puVar3 = (undefined8 *)(pcVar1->proto).ftpc.pp.response_time;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *(undefined4 *)(puVar3 + 4) = 0;
  uVar6 = (short)msg_len + 0x20;
  *(ushort *)((long)puVar3 + 2) = uVar6 * 0x100 | uVar6 >> 8;
  *(undefined4 *)((long)puVar3 + 4) = 0x424d53ff;
  *(uchar *)(puVar3 + 1) = cmd;
  *(undefined1 *)((long)puVar3 + 0xd) = 0x18;
  *(undefined2 *)((long)puVar3 + 0xe) = 0x41;
  *(unsigned_short *)(puVar3 + 4) = (pcVar1->proto).smbc.uid;
  *(unsigned_short *)((long)puVar3 + 0x1c) = psVar2->tid;
  _Var4 = getpid();
  *(short *)(puVar3 + 2) = (short)((uint)_Var4 >> 0x10);
  *(short *)((long)puVar3 + 0x1e) = (short)_Var4;
  memcpy((void *)((pcVar1->proto).ftpc.pp.response_time + 0x24),msg,msg_len);
  CVar5 = smb_send(data,msg_len + 0x24,0);
  return CVar5;
}

Assistant:

static CURLcode smb_send_message(struct Curl_easy *data, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;

  smb_format_message(data, (struct smb_header *)smbc->send_buf,
                     cmd, msg_len);
  DEBUGASSERT((sizeof(struct smb_header) + msg_len) <= MAX_MESSAGE_SIZE);
  memcpy(smbc->send_buf + sizeof(struct smb_header), msg, msg_len);

  return smb_send(data, sizeof(struct smb_header) + msg_len, 0);
}